

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O3

RK_S32 decode_vui(HEVCContext *s,HEVCSPS *sps)

{
  RK_S32 *pRVar1;
  HEVCWindow *pHVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BitReadCtx_t *bitctx;
  MPP_RET MVar5;
  RK_S32 *pRVar6;
  RK_S32 _out;
  MPP_RET local_1c;
  
  bitctx = &s->HEVClc->gb;
  if (((byte)h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding VUI\n",(char *)0x0);
  }
  (sps->vui).colour_primaries = '\x02';
  (sps->vui).transfer_characteristic = '\x02';
  (sps->vui).matrix_coeffs = '\x02';
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  if (local_1c != MPP_OK) {
    MVar5 = mpp_read_bits(bitctx,8,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    if ((byte)local_1c < 0x11) {
      (sps->vui).sar = vui_sar[(uint)(local_1c & 0x1f)];
    }
    else if ((byte)local_1c == 0xff) {
      MVar5 = mpp_read_bits(bitctx,0x10,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).sar.num = local_1c;
      MVar5 = mpp_read_bits(bitctx,0x10,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).sar.den = local_1c;
    }
    else {
      _mpp_log_l(4,"H265PARSER_PS","Unknown SAR index: %u.\n",(char *)0x0);
    }
  }
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).overscan_info_present_flag = local_1c;
  if (local_1c != MPP_OK) {
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).overscan_appropriate_flag = local_1c;
  }
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).video_signal_type_present_flag = local_1c;
  if (local_1c != MPP_OK) {
    MVar5 = mpp_read_bits(bitctx,3,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).video_format = local_1c;
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).video_full_range_flag = local_1c;
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).colour_description_present_flag = local_1c;
    if (local_1c != MPP_OK) {
      MVar5 = mpp_read_bits(bitctx,8,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).colour_primaries = (undefined1)local_1c;
      MVar5 = mpp_read_bits(bitctx,8,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).transfer_characteristic = (undefined1)local_1c;
      MVar5 = mpp_read_bits(bitctx,8,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).matrix_coeffs = (undefined1)local_1c;
      if (((sps->vui).transfer_characteristic | 2) == 0x12) {
        s->is_hdr = 1;
      }
      if (0xe < (byte)(undefined1)local_1c) {
        (sps->vui).matrix_coeffs = '\x02';
      }
    }
  }
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).chroma_loc_info_present_flag = local_1c;
  if (local_1c != MPP_OK) {
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).chroma_sample_loc_type_top_field = local_1c;
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).chroma_sample_loc_type_bottom_field = local_1c;
  }
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).neutra_chroma_indication_flag = local_1c;
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).field_seq_flag = local_1c;
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).frame_field_info_present_flag = local_1c;
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).default_display_window_flag = local_1c;
  if (local_1c != MPP_OK) {
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).def_disp_win.left_offset = local_1c;
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).def_disp_win.right_offset = local_1c;
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).def_disp_win.top_offset = local_1c;
    MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).def_disp_win.bottom_offset = local_1c;
    if (sps->chroma_format_idc == 2) {
      pHVar2 = &(sps->vui).def_disp_win;
      pHVar2->left_offset = pHVar2->left_offset << 1;
      pRVar6 = &(sps->vui).def_disp_win.right_offset;
      MVar5 = (sps->vui).def_disp_win.right_offset;
    }
    else {
      if (sps->chroma_format_idc != 1) goto LAB_001a2db5;
      pRVar6 = &(sps->vui).def_disp_win.bottom_offset;
      uVar3 = (sps->vui).def_disp_win.left_offset;
      uVar4 = (sps->vui).def_disp_win.right_offset;
      (sps->vui).def_disp_win.left_offset = uVar3 * 2;
      (sps->vui).def_disp_win.right_offset = uVar4 * 2;
      pRVar1 = &(sps->vui).def_disp_win.top_offset;
      *pRVar1 = *pRVar1 << 1;
      MVar5 = local_1c;
    }
    *pRVar6 = MVar5 * 2;
  }
LAB_001a2db5:
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if (MVar5 != MPP_OK) {
    return MVar5;
  }
  (sps->vui).vui_timing_info_present_flag = local_1c;
  if (local_1c != MPP_OK) {
    mpp_read_longbits(bitctx,0x20,&(sps->vui).vui_num_units_in_tick);
    mpp_read_longbits(bitctx,0x20,&(sps->vui).vui_time_scale);
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).vui_poc_proportional_to_timing_flag = local_1c;
    if (local_1c != MPP_OK) {
      MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return MVar5;
      }
      (sps->vui).vui_num_ticks_poc_diff_one_minus1 = local_1c;
    }
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return MVar5;
    }
    (sps->vui).vui_hrd_parameters_present_flag = local_1c;
    if (local_1c != MPP_OK) {
      decode_hrd(s,1,sps->max_sub_layers);
    }
  }
  MVar5 = mpp_read_bits(bitctx,1,&local_1c);
  bitctx->ret = MVar5;
  if ((MVar5 == MPP_OK) &&
     ((sps->vui).bitstream_restriction_flag = local_1c, MVar5 = local_1c, local_1c != MPP_OK)) {
    MVar5 = mpp_read_bits(bitctx,1,&local_1c);
    bitctx->ret = MVar5;
    if (MVar5 == MPP_OK) {
      (sps->vui).tiles_fixed_structure_flag = local_1c;
      MVar5 = mpp_read_bits(bitctx,1,&local_1c);
      bitctx->ret = MVar5;
      if (MVar5 == MPP_OK) {
        (sps->vui).motion_vectors_over_pic_boundaries_flag = local_1c;
        MVar5 = mpp_read_bits(bitctx,1,&local_1c);
        bitctx->ret = MVar5;
        if (MVar5 == MPP_OK) {
          (sps->vui).restricted_ref_pic_lists_flag = local_1c;
          MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
          bitctx->ret = MVar5;
          if (MVar5 == MPP_OK) {
            (sps->vui).min_spatial_segmentation_idc = local_1c;
            MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
            bitctx->ret = MVar5;
            if (MVar5 == MPP_OK) {
              (sps->vui).max_bytes_per_pic_denom = local_1c;
              MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
              bitctx->ret = MVar5;
              if (MVar5 == MPP_OK) {
                (sps->vui).max_bits_per_min_cu_denom = local_1c;
                MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
                bitctx->ret = MVar5;
                if (MVar5 == MPP_OK) {
                  (sps->vui).log2_max_mv_length_horizontal = local_1c;
                  MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&local_1c);
                  bitctx->ret = MVar5;
                  if (MVar5 == MPP_OK) {
                    (sps->vui).log2_max_mv_length_vertical = local_1c;
                    MVar5 = local_1c;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return MVar5;
}

Assistant:

static RK_S32 decode_vui(HEVCContext *s, HEVCSPS *sps)
{
    VUI *vui          = &sps->vui;
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_S32 sar_present;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding VUI\n");

    vui->colour_primaries = MPP_FRAME_PRI_UNSPECIFIED;
    vui->transfer_characteristic = MPP_FRAME_TRC_UNSPECIFIED;
    vui->matrix_coeffs = MPP_FRAME_SPC_UNSPECIFIED;

    READ_ONEBIT(gb, &sar_present);
    if (sar_present) {
        RK_U8 sar_idx = 0;
        READ_BITS(gb, 8, &sar_idx);
        if (sar_idx < MPP_ARRAY_ELEMS(vui_sar))
            vui->sar = vui_sar[sar_idx];
        else if (sar_idx == 255) {
            READ_BITS(gb, 16, &vui->sar.num);
            READ_BITS(gb, 16, &vui->sar.den);
        } else
            mpp_log("Unknown SAR index: %u.\n", sar_idx);
    }

    READ_ONEBIT(gb, &vui->overscan_info_present_flag);
    if (vui->overscan_info_present_flag)
        READ_ONEBIT(gb, &vui->overscan_appropriate_flag);

    READ_ONEBIT(gb, &vui->video_signal_type_present_flag);
    if (vui->video_signal_type_present_flag) {
        READ_BITS(gb, 3, & vui->video_format);
        READ_ONEBIT(gb, &vui->video_full_range_flag);
        READ_ONEBIT(gb, &vui->colour_description_present_flag);

        if (vui->colour_description_present_flag) {
            READ_BITS(gb, 8, &vui->colour_primaries);
            READ_BITS(gb, 8, &vui->transfer_characteristic);
            READ_BITS(gb, 8, &vui->matrix_coeffs);

            // Set invalid values to "unspecified"
            //  if (vui->colour_primaries >= RKCOL_PRI_NB)
            //      vui->colour_primaries = RKCOL_PRI_UNSPECIFIED;
            //  if (vui->transfer_characteristic >= RKCOL_TRC_NB)
            //      vui->transfer_characteristic = RKCOL_TRC_UNSPECIFIED;
            if (vui->transfer_characteristic == MPP_FRAME_TRC_SMPTEST2084 ||
                vui->transfer_characteristic == MPP_FRAME_TRC_ARIB_STD_B67)
                s->is_hdr = 1;
            if (vui->matrix_coeffs >= MPP_FRAME_SPC_NB)
                vui->matrix_coeffs = MPP_FRAME_SPC_UNSPECIFIED;
        }
    }

    READ_ONEBIT(gb, &vui->chroma_loc_info_present_flag );
    if (vui->chroma_loc_info_present_flag) {
        READ_UE(gb, &vui->chroma_sample_loc_type_top_field);
        READ_UE(gb, &vui->chroma_sample_loc_type_bottom_field);
    }

    READ_ONEBIT(gb, &vui->neutra_chroma_indication_flag);
    READ_ONEBIT(gb, &vui->field_seq_flag);
    READ_ONEBIT(gb, &vui->frame_field_info_present_flag);

    READ_ONEBIT(gb, &vui->default_display_window_flag);
    if (vui->default_display_window_flag) {
        READ_UE(gb, &vui->def_disp_win.left_offset);
        READ_UE(gb, &vui->def_disp_win.right_offset);
        READ_UE(gb, &vui->def_disp_win.top_offset);
        READ_UE(gb, &vui->def_disp_win.bottom_offset);
        if (sps) {
            if (sps->chroma_format_idc == H265_CHROMA_420) {
                vui->def_disp_win.left_offset   *= 2;
                vui->def_disp_win.right_offset  *= 2;
                vui->def_disp_win.top_offset    *= 2;
                vui->def_disp_win.bottom_offset *= 2;
            } else if (sps->chroma_format_idc == H265_CHROMA_422) {
                vui->def_disp_win.left_offset   *= 2;
                vui->def_disp_win.right_offset  *= 2;
            }
        }

#if 0
        if (s->apply_defdispwin &&
            s->h265dctx->flags2 & CODEC_FLAG2_IGNORE_CROP) {
            h265d_dbg(H265D_DBG_SPS,
                      "discarding vui default display window, "
                      "original values are l:%u r:%u t:%u b:%u\n",
                      vui->def_disp_win.left_offset,
                      vui->def_disp_win.right_offset,
                      vui->def_disp_win.top_offset,
                      vui->def_disp_win.bottom_offset);

            vui->def_disp_win.left_offset   =
                vui->def_disp_win.right_offset  =
                    vui->def_disp_win.top_offset    =
                        vui->def_disp_win.bottom_offset = 0;
        }
#endif
    }

    READ_ONEBIT(gb, &vui->vui_timing_info_present_flag);

    if (vui->vui_timing_info_present_flag) {
        mpp_read_longbits(gb, 32, &vui->vui_num_units_in_tick);
        mpp_read_longbits(gb, 32, &vui->vui_time_scale);
        READ_ONEBIT(gb, &vui->vui_poc_proportional_to_timing_flag);
        if (vui->vui_poc_proportional_to_timing_flag)
            READ_UE(gb, &vui->vui_num_ticks_poc_diff_one_minus1);
        READ_ONEBIT(gb, &vui->vui_hrd_parameters_present_flag);
        if (vui->vui_hrd_parameters_present_flag)
            decode_hrd(s, 1, sps->max_sub_layers);
    }

    READ_ONEBIT(gb, &vui->bitstream_restriction_flag);
    if (vui->bitstream_restriction_flag) {
        READ_ONEBIT(gb, &vui->tiles_fixed_structure_flag);
        READ_ONEBIT(gb, &vui->motion_vectors_over_pic_boundaries_flag);
        READ_ONEBIT(gb, &vui->restricted_ref_pic_lists_flag);
        READ_UE(gb, &vui->min_spatial_segmentation_idc);
        READ_UE(gb, &vui->max_bytes_per_pic_denom);
        READ_UE(gb, &vui->max_bits_per_min_cu_denom);
        READ_UE(gb, &vui->log2_max_mv_length_horizontal);
        READ_UE(gb, &vui->log2_max_mv_length_vertical);
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}